

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall
capnp::DynamicList::Builder::adopt(Builder *this,uint index,Orphan<capnp::DynamicValue> *orphan)

{
  StructBuilder other;
  uint index_00;
  bool bVar1;
  Which WVar2;
  StructSize size;
  uint uVar3;
  OrphanBuilder *pOVar4;
  bool local_2f1;
  bool local_2d9;
  bool local_2c9;
  PointerBuilder local_298;
  Fault local_280;
  Fault f_5;
  Type local_26c;
  Type local_268;
  DebugExpression<capnp::DynamicValue::Type> local_264;
  DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> local_260;
  bool local_239;
  Schema SStack_238;
  bool _kjCondition_4;
  InterfaceSchema elementType_2;
  Fault f_4;
  StructBuilder local_218;
  StructBuilder local_1f0;
  Fault local_1c8;
  Fault f_3;
  Type local_1b8;
  DebugExpression<capnp::DynamicValue::Type> local_1b4;
  DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> local_1b0;
  bool local_189;
  Schema SStack_188;
  bool _kjCondition_3;
  StructSchema elementType_1;
  Fault local_168;
  Fault f_2;
  Type local_158;
  DebugExpression<capnp::DynamicValue::Type> local_154;
  DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> local_150;
  bool local_129;
  undefined1 auStack_128 [7];
  bool _kjCondition_2;
  ListSchema elementType;
  Fault local_100;
  Fault f_1;
  Type local_f0;
  DebugExpression<capnp::DynamicValue::Type> local_ec;
  undefined1 local_e8 [8];
  DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> _kjCondition_1;
  Fault local_b0;
  Fault f;
  Type local_a0;
  DebugExpression<capnp::DynamicValue::Type> local_9c;
  undefined1 local_98 [8];
  DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> _kjCondition;
  Reader local_68;
  Orphan<capnp::DynamicValue> *local_20;
  Orphan<capnp::DynamicValue> *orphan_local;
  Builder *pBStack_10;
  uint index_local;
  Builder *this_local;
  
  local_20 = orphan;
  orphan_local._4_4_ = index;
  pBStack_10 = this;
  WVar2 = ListSchema::whichElementType(&this->schema);
  index_00 = orphan_local._4_4_;
  switch(WVar2) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case ENUM:
    Orphan<capnp::DynamicValue>::getReader(&local_68,local_20);
    set(this,index_00,&local_68);
    DynamicValue::Reader::~Reader(&local_68);
    break;
  case TEXT:
    local_a0 = Orphan<capnp::DynamicValue>::getType(local_20);
    local_9c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a0);
    f.exception._4_4_ = 6;
    kj::_::DebugExpression<capnp::DynamicValue::Type>::operator==
              ((DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> *)local_98,
               &local_9c,(Type *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type,capnp::DynamicValue::Type>&,char_const(&)[21]>
                (&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x52b,FAILED,"orphan.getType() == DynamicValue::TEXT",
                 "_kjCondition,\"Value type mismatch.\"",
                 (DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> *)local_98,
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal(&local_b0);
    }
    uVar3 = bounded<unsigned_int>(orphan_local._4_4_);
    capnp::_::ListBuilder::getPointerElement
              ((PointerBuilder *)&_kjCondition_1.result,&this->builder,uVar3);
    pOVar4 = kj::mv<capnp::_::OrphanBuilder>(&local_20->builder);
    capnp::_::PointerBuilder::adopt((PointerBuilder *)&_kjCondition_1.result,pOVar4);
    break;
  case DATA:
    local_f0 = Orphan<capnp::DynamicValue>::getType(local_20);
    local_ec = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f0);
    f_1.exception._4_4_ = 7;
    kj::_::DebugExpression<capnp::DynamicValue::Type>::operator==
              ((DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> *)local_e8,
               &local_ec,(Type *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e8);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type,capnp::DynamicValue::Type>&,char_const(&)[21]>
                (&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x530,FAILED,"orphan.getType() == DynamicValue::DATA",
                 "_kjCondition,\"Value type mismatch.\"",
                 (DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> *)local_e8,
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal(&local_100);
    }
    uVar3 = bounded<unsigned_int>(orphan_local._4_4_);
    capnp::_::ListBuilder::getPointerElement
              ((PointerBuilder *)&elementType.elementType.field_4,&this->builder,uVar3);
    pOVar4 = kj::mv<capnp::_::OrphanBuilder>(&local_20->builder);
    capnp::_::PointerBuilder::adopt((PointerBuilder *)&elementType.elementType.field_4,pOVar4);
    break;
  case LIST:
    _auStack_128 = (Type)ListSchema::getListElementType(&this->schema);
    local_158 = Orphan<capnp::DynamicValue>::getType(local_20);
    local_154 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_158);
    f_2.exception._4_4_ = 8;
    kj::_::DebugExpression<capnp::DynamicValue::Type>::operator==
              (&local_150,&local_154,(Type *)((long)&f_2.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_150);
    local_2c9 = false;
    if (bVar1) {
      local_2c9 = ListSchema::operator==(&(local_20->field_1).listSchema,(ListSchema *)auStack_128);
    }
    local_129 = local_2c9;
    if (local_2c9 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[21]>
                (&local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x537,FAILED,
                 "orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType",
                 "_kjCondition,\"Value type mismatch.\"",&local_129,
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal(&local_168);
    }
    uVar3 = bounded<unsigned_int>(orphan_local._4_4_);
    capnp::_::ListBuilder::getPointerElement((PointerBuilder *)&elementType_1,&this->builder,uVar3);
    pOVar4 = kj::mv<capnp::_::OrphanBuilder>(&local_20->builder);
    capnp::_::PointerBuilder::adopt((PointerBuilder *)&elementType_1,pOVar4);
    break;
  case STRUCT:
    SStack_188.raw = (RawBrandedSchema *)ListSchema::getStructElementType(&this->schema);
    local_1b8 = Orphan<capnp::DynamicValue>::getType(local_20);
    local_1b4 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1b8);
    f_3.exception._4_4_ = 10;
    kj::_::DebugExpression<capnp::DynamicValue::Type>::operator==
              (&local_1b0,&local_1b4,(Type *)((long)&f_3.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_1b0);
    local_2d9 = false;
    if (bVar1) {
      local_2d9 = Schema::operator==((Schema *)&(local_20->field_1).enumValue,
                                     &stack0xfffffffffffffe78);
    }
    local_189 = local_2d9;
    if (local_2d9 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[21]>
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x53f,FAILED,
                 "orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType",
                 "_kjCondition,\"Value type mismatch.\"",&local_189,
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal(&local_1c8);
    }
    uVar3 = bounded<unsigned_int>(orphan_local._4_4_);
    capnp::_::ListBuilder::getStructElement(&local_1f0,&this->builder,uVar3);
    pOVar4 = &local_20->builder;
    size = anon_unknown_70::structSizeFromSchema((StructSchema)SStack_188.raw);
    capnp::_::OrphanBuilder::asStruct(&local_218,pOVar4,size);
    other.capTable = local_218.capTable;
    other.segment = local_218.segment;
    other.data = local_218.data;
    other.pointers = local_218.pointers;
    other.dataSize = local_218.dataSize;
    other.pointerCount = local_218.pointerCount;
    other._38_2_ = local_218._38_2_;
    capnp::_::StructBuilder::transferContentFrom(&local_1f0,other);
    break;
  case INTERFACE:
    SStack_238.raw = (RawBrandedSchema *)ListSchema::getInterfaceElementType(&this->schema);
    local_268 = Orphan<capnp::DynamicValue>::getType(local_20);
    local_264 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_268);
    local_26c = CAPABILITY;
    kj::_::DebugExpression<capnp::DynamicValue::Type>::operator==(&local_260,&local_264,&local_26c);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_260);
    local_2f1 = false;
    if (bVar1) {
      f_5.exception = (Exception *)SStack_238.raw;
      local_2f1 = InterfaceSchema::extends
                            (&(local_20->field_1).interfaceSchema,(InterfaceSchema)SStack_238.raw);
    }
    local_239 = local_2f1;
    if (local_2f1 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[21]>
                (&local_280,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x54c,FAILED,
                 "orphan.getType() == DynamicValue::CAPABILITY && orphan.interfaceSchema.extends(elementType)"
                 ,"_kjCondition,\"Value type mismatch.\"",&local_239,
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal(&local_280);
    }
    uVar3 = bounded<unsigned_int>(orphan_local._4_4_);
    capnp::_::ListBuilder::getPointerElement(&local_298,&this->builder,uVar3);
    pOVar4 = kj::mv<capnp::_::OrphanBuilder>(&local_20->builder);
    capnp::_::PointerBuilder::adopt(&local_298,pOVar4);
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&elementType_2,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x546,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal((Fault *)&elementType_2);
  default:
    kj::_::unreachable();
  }
  return;
}

Assistant:

void DynamicList::Builder::adopt(uint index, Orphan<DynamicValue>&& orphan) {
  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
      set(index, orphan.getReader());
      return;

    case schema::Type::TEXT:
      KJ_REQUIRE(orphan.getType() == DynamicValue::TEXT, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::DATA:
      KJ_REQUIRE(orphan.getType() == DynamicValue::DATA, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType,
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }

    case schema::Type::STRUCT: {
      auto elementType = schema.getStructElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType,
                 "Value type mismatch.");
      builder.getStructElement(bounded(index) * ELEMENTS).transferContentFrom(
          orphan.builder.asStruct(structSizeFromSchema(elementType)));
      return;
    }

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");

    case schema::Type::INTERFACE: {
      auto elementType = schema.getInterfaceElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::CAPABILITY &&
                 orphan.interfaceSchema.extends(elementType),
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }
  }

  KJ_UNREACHABLE;
}